

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O3

void __thiscall Fl_Tree::load(Fl_Tree *this,Fl_Preferences *prefs)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *__s_00;
  ulong uVar4;
  char *__format;
  long lVar5;
  int iVar6;
  uint uVar7;
  Fl_Preferences prefsChild;
  int local_58;
  Fl_Preferences local_50;
  long local_38;
  
  __s = prefs->node->path_;
  sVar2 = strlen(__s);
  lVar5 = 2;
  if (*__s == '.') {
    lVar5 = 2 - (ulong)(__s[1] == '\0');
  }
  iVar1 = Fl_Preferences::groups(prefs);
  if (0 < iVar1) {
    iVar6 = 0;
    do {
      Fl_Preferences::Fl_Preferences(&local_50,prefs,iVar6);
      add(this,(local_50.node)->path_ + 2,(Fl_Tree_Item *)0x0);
      load(this,&local_50);
      Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_50);
      iVar6 = iVar6 + 1;
    } while (iVar1 != iVar6);
  }
  iVar1 = Fl_Preferences::entries(prefs);
  if (0 < iVar1) {
    local_58 = (int)sVar2;
    local_38 = (long)local_58 + 0x2d;
    iVar6 = 0;
    do {
      pcVar3 = Fl_Preferences::entry(prefs,iVar6);
      pcVar3 = strdup(pcVar3);
      sVar2 = strlen(pcVar3);
      if (0 < (int)(uint)sVar2) {
        uVar4 = 0;
        do {
          if (pcVar3[uVar4] == '/') {
            pcVar3[uVar4] = '\\';
          }
          uVar4 = uVar4 + 1;
        } while (((uint)sVar2 & 0x7fffffff) != uVar4);
      }
      Fl_Preferences::get(prefs,pcVar3,(char **)&local_50,"");
      sVar2 = strlen((char *)local_50._vptr_Fl_Preferences);
      uVar7 = (uint)sVar2;
      if ((int)uVar7 < 1) {
LAB_001da123:
        sVar2 = strlen(pcVar3);
        __s_00 = (char *)malloc((long)(int)uVar7 + (long)local_58 + 5 + sVar2);
        __format = "%s/%s = %s";
      }
      else {
        uVar4 = 0;
        do {
          if (*(char *)((long)local_50._vptr_Fl_Preferences + uVar4) == '/') {
            *(char *)((long)local_50._vptr_Fl_Preferences + uVar4) = '\\';
          }
          uVar4 = uVar4 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar4);
        if ((int)uVar7 < 0x28) goto LAB_001da123;
        sVar2 = strlen(pcVar3);
        __s_00 = (char *)malloc(sVar2 + local_38);
        __format = "%s/%s = %.40s...";
      }
      sprintf(__s_00,__format,__s + lVar5,pcVar3,local_50._vptr_Fl_Preferences);
      add(this,__s_00 + (*__s_00 == '/'),(Fl_Tree_Item *)0x0);
      free(__s_00);
      free(local_50._vptr_Fl_Preferences);
      free(pcVar3);
      iVar6 = iVar6 + 1;
    } while (iVar6 != iVar1);
  }
  return;
}

Assistant:

void Fl_Tree::load(Fl_Preferences &prefs) {
  int i, j, n, pn = (int) strlen(prefs.path());
  char *p;
  const char *path = prefs.path();
  if (strcmp(path, ".")==0)
    path += 1; // root path is empty
  else
    path += 2; // child path starts with "./"
  n = prefs.groups();
  for (i=0; i<n; i++) {
    Fl_Preferences prefsChild(prefs, i);
    add(prefsChild.path()+2); // children always start with "./"
    load(prefsChild);
  }
  n = prefs.entries();
  for (i=0; i<n; i++) {
    // We must remove all fwd slashes in the key and value strings. Replace with backslash.
    char *key = strdup(prefs.entry(i));
    int kn = (int) strlen(key);
    for (j=0; j<kn; j++) {
      if (key[j]=='/') key[j]='\\'; 
    }
    char *val;  prefs.get(key, val, "");
    int vn = (int) strlen(val);
    for (j=0; j<vn; j++) {
      if (val[j]=='/') val[j]='\\'; 
    }
    if (vn<40) {
      size_t sze = pn + strlen(key) + vn;
      p = (char*)malloc(sze+5);
      sprintf(p, "%s/%s = %s", path, key, val);
    } else {
      size_t sze = pn + strlen(key) + 40;
      p = (char*)malloc(sze+5);
      sprintf(p, "%s/%s = %.40s...", path, key, val);
    }
    add(p[0]=='/'?p+1:p);
    free(p);
    free(val);
    free(key);
  }
}